

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O3

bool cmTargetPropertyComputer::WhiteListedInterfaceProperty(string *prop)

{
  char *pcVar1;
  int iVar2;
  const_iterator cVar3;
  long *plVar4;
  long lVar5;
  bool bVar6;
  undefined1 local_1cb;
  undefined1 local_1ca;
  undefined1 local_1c9;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48 [2];
  long local_38 [2];
  
  pcVar1 = (prop->_M_dataplus)._M_p;
  iVar2 = strncmp(pcVar1,"INTERFACE_",10);
  bVar6 = true;
  if ((iVar2 != 0) && (iVar2 = (int)*pcVar1, iVar2 != 0x5f)) {
    iVar2 = islower(iVar2);
    if (iVar2 == 0) {
      if (WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_ == '\0') {
        iVar2 = __cxa_guard_acquire(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                                     builtIns_abi_cxx11_);
        if (iVar2 != 0) {
          local_1c8[0] = local_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"COMPATIBLE_INTERFACE_BOOL","");
          local_1a8[0] = local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"COMPATIBLE_INTERFACE_NUMBER_MAX","");
          local_188[0] = local_178;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_188,"COMPATIBLE_INTERFACE_NUMBER_MIN","");
          local_168[0] = local_158;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_168,"COMPATIBLE_INTERFACE_STRING","");
          local_148[0] = local_138;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"EXPORT_NAME","");
          local_128[0] = local_118;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_128,"EXPORT_PROPERTIES","");
          local_108[0] = local_f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"IMPORTED","");
          local_e8[0] = local_d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"IMPORTED_GLOBAL","");
          local_c8[0] = local_b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,"MANUALLY_ADDED_DEPENDENCIES","");
          local_a8[0] = local_98;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"NAME","");
          local_88[0] = local_78;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"PRIVATE_HEADER","");
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"PUBLIC_HEADER","");
          plVar4 = local_38;
          local_48[0] = plVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"TYPE","");
          std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::_Hashtable<std::__cxx11::string_const*>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                         builtIns_abi_cxx11_,local_1c8,&stack0xffffffffffffffd8,0,&local_1c9,
                     &local_1ca,&local_1cb);
          lVar5 = -0x1a0;
          do {
            if (plVar4 != (long *)plVar4[-2]) {
              operator_delete((long *)plVar4[-2],*plVar4 + 1);
            }
            plVar4 = plVar4 + -4;
            lVar5 = lVar5 + 0x20;
          } while (lVar5 != 0);
          __cxa_atexit(std::
                       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::~unordered_set,
                       &WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                        builtIns_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                               builtIns_abi_cxx11_);
        }
      }
      cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_
                      ._M_h,prop);
      if (cVar3.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        iVar2 = std::__cxx11::string::compare((char *)prop);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)prop);
          if (iVar2 != 0) {
            pcVar1 = (prop->_M_dataplus)._M_p;
            iVar2 = strncmp(pcVar1,"IMPORTED_LIBNAME_",0x11);
            if (iVar2 != 0) {
              iVar2 = strncmp(pcVar1,"MAP_IMPORTED_CONFIG_",0x14);
              if (iVar2 != 0) {
                iVar2 = std::__cxx11::string::compare((char *)prop);
                bVar6 = iVar2 == 0;
              }
            }
          }
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool cmTargetPropertyComputer::WhiteListedInterfaceProperty(
  const std::string& prop)
{
  if (cmHasLiteralPrefix(prop, "INTERFACE_")) {
    return true;
  }
  if (cmHasLiteralPrefix(prop, "_")) {
    return true;
  }
  if (std::islower(prop[0])) {
    return true;
  }
  static std::unordered_set<std::string> const builtIns{
    "COMPATIBLE_INTERFACE_BOOL",
    "COMPATIBLE_INTERFACE_NUMBER_MAX",
    "COMPATIBLE_INTERFACE_NUMBER_MIN",
    "COMPATIBLE_INTERFACE_STRING",
    "EXPORT_NAME",
    "EXPORT_PROPERTIES",
    "IMPORTED",
    "IMPORTED_GLOBAL",
    "MANUALLY_ADDED_DEPENDENCIES",
    "NAME",
    "PRIVATE_HEADER",
    "PUBLIC_HEADER",
    "TYPE"
  };

  if (builtIns.count(prop)) {
    return true;
  }

  if (prop == "IMPORTED_CONFIGURATIONS" || prop == "IMPORTED_LIBNAME" ||
      cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME_") ||
      cmHasLiteralPrefix(prop, "MAP_IMPORTED_CONFIG_")) {
    return true;
  }

  // This property should not be allowed but was incorrectly added in
  // CMake 3.8.  We can't remove it from the whitelist without breaking
  // projects that try to set it.  One day we could warn about this, but
  // for now silently accept it.
  if (prop == "NO_SYSTEM_FROM_IMPORTED") {
    return true;
  }

  return false;
}